

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaOutputFile::ToYca::writePixels(ToYca *this,int numScanLines)

{
  ostream *poVar1;
  char *pcVar2;
  ArgExc *this_00;
  int *piVar3;
  int in_ESI;
  ToYca *in_RDI;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  int i_1;
  int j;
  int i;
  stringstream _iex_throw_s;
  int in_stack_000000bc;
  OutputFile *in_stack_000000c0;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  int n;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar4;
  int local_1a8;
  stringstream local_198 [16];
  ostream local_188 [8];
  Rgba *in_stack_fffffffffffffe80;
  Rgba *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  
  if (in_RDI->_fbBase != (Rgba *)0x0) {
    if (((in_RDI->_writeY & 1U) == 0) || ((in_RDI->_writeC & 1U) != 0)) {
      for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
        for (n = 0; n < in_RDI->_width; n = n + 1) {
          in_RDI->_tmpBuf[n + 0xd] =
               in_RDI->_fbBase
               [in_RDI->_fbYStride * (long)in_RDI->_currentScanLine +
                in_RDI->_fbXStride * (long)(n + in_RDI->_xMin)];
        }
        RgbaYca::RGBAtoYCA((V3f *)CONCAT44(in_stack_fffffffffffffe54,iVar4),n,
                           SUB41((uint)in_stack_fffffffffffffe48 >> 0x18,0),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (Rgba *)in_RDI);
        padTmpBuf(in_RDI);
        rotateBuffers(in_RDI);
        RgbaYca::decimateChromaHoriz
                  (in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        if (in_RDI->_linesConverted == 0) {
          for (in_stack_fffffffffffffe48 = 0; in_stack_fffffffffffffe48 < 0xd;
              in_stack_fffffffffffffe48 = in_stack_fffffffffffffe48 + 1) {
            duplicateLastBuffer((ToYca *)CONCAT44(in_stack_fffffffffffffe14,
                                                  in_stack_fffffffffffffe10));
          }
        }
        in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
        if (0xd < in_RDI->_linesConverted) {
          decimateChromaVertAndWriteScanLine
                    ((ToYca *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        }
        if (in_RDI->_height <= in_RDI->_linesConverted) {
          for (in_stack_fffffffffffffe44 = 0; in_stack_fffffffffffffe44 < 0xd - in_RDI->_height;
              in_stack_fffffffffffffe44 = in_stack_fffffffffffffe44 + 1) {
            duplicateLastBuffer((ToYca *)CONCAT44(in_stack_fffffffffffffe14,
                                                  in_stack_fffffffffffffe10));
          }
          duplicateSecondToLastBuffer
                    ((ToYca *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
          decimateChromaVertAndWriteScanLine
                    ((ToYca *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          in_stack_fffffffffffffe14 = 1;
          while (in_stack_fffffffffffffe40 = in_stack_fffffffffffffe14,
                piVar3 = std::min<int>(&in_RDI->_height,&RgbaYca::N2),
                in_stack_fffffffffffffe14 < *piVar3) {
            duplicateLastBuffer((ToYca *)CONCAT44(in_stack_fffffffffffffe14,
                                                  in_stack_fffffffffffffe10));
            in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
            decimateChromaVertAndWriteScanLine
                      ((ToYca *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            in_stack_fffffffffffffe14 = in_stack_fffffffffffffe40 + 1;
          }
        }
        if (in_RDI->_lineOrder == INCREASING_Y) {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + 1;
        }
        else {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + -1;
        }
      }
    }
    else {
      for (local_1a8 = 0; local_1a8 < in_ESI; local_1a8 = local_1a8 + 1) {
        for (iVar4 = 0; iVar4 < in_RDI->_width; iVar4 = iVar4 + 1) {
          in_RDI->_tmpBuf[iVar4] =
               in_RDI->_fbBase
               [in_RDI->_fbYStride * (long)in_RDI->_currentScanLine +
                in_RDI->_fbXStride * (long)(iVar4 + in_RDI->_xMin)];
        }
        RgbaYca::RGBAtoYCA((V3f *)CONCAT44(iVar4,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe4c,
                           SUB41((uint)in_stack_fffffffffffffe48 >> 0x18,0),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (Rgba *)in_RDI);
        OutputFile::writePixels(in_stack_000000c0,in_stack_000000bc);
        in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
        if (in_RDI->_lineOrder == INCREASING_Y) {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + 1;
        }
        else {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + -1;
        }
      }
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,
                           "No frame buffer was specified as the pixel data source for image file \""
                          );
  pcVar2 = OutputFile::fileName((OutputFile *)0x13d678);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
RgbaOutputFile::ToYca::writePixels (int numScanLines)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data source for image file "
			    "\"" << _outputFile.fileName() << "\".");
    }

    if (_writeY && !_writeC)
    {
	//
	// We are writing only luminance; filtering
	// and subsampling are not necessary.
	//

	for (int i = 0; i < numScanLines; ++i)
	{
	    //
	    // Copy the next scan line from the caller's
	    // frame buffer into _tmpBuf.
	    //

	    for (int j = 0; j < _width; ++j)
	    {
		_tmpBuf[j] = _fbBase[_fbYStride * _currentScanLine +
				     _fbXStride * (j + _xMin)];
	    }

	    //
	    // Convert the scan line from RGB to luminance/chroma,
	    // and store the result in the output file.
	    //

	    RGBAtoYCA (_yw, _width, _writeA, _tmpBuf, _tmpBuf);
	    _outputFile.writePixels (1);

	    ++_linesConverted;

	    if (_lineOrder == INCREASING_Y)
		++_currentScanLine;
	    else
		--_currentScanLine;
	}
    }
    else
    {
	//
	// We are writing chroma; the pixels must be filtered and subsampled.
	//

	for (int i = 0; i < numScanLines; ++i)
	{
	    //
	    // Copy the next scan line from the caller's
	    // frame buffer into _tmpBuf.
	    //

	    for (int j = 0; j < _width; ++j)
	    {
		_tmpBuf[j + N2] = _fbBase[_fbYStride * _currentScanLine +
					  _fbXStride * (j + _xMin)];
	    }

	    //
	    // Convert the scan line from RGB to luminance/chroma.
	    //

	    RGBAtoYCA (_yw, _width, _writeA, _tmpBuf + N2, _tmpBuf + N2);

	    //
	    // Append N2 copies of the first and last pixel to the
	    // beginning and end of the scan line.
	    //

	    padTmpBuf ();

	    //
	    // Filter and subsample the scan line's chroma channels
	    // horizontally; store the result in _buf.
	    //

	    rotateBuffers();
	    decimateChromaHoriz (_width, _tmpBuf, _buf[N - 1]);

	    //
	    // If this is the first scan line in the image,
	    // store N2 more copies of the scan line in _buf.
	    //

	    if (_linesConverted == 0)
	    {
		for (int j = 0; j < N2; ++j)
		    duplicateLastBuffer();
	    }

	    ++_linesConverted;

	    //
	    // If we have have converted at least N2 scan lines from
	    // RGBA to luminance/chroma, then we can start to filter
	    // and subsample vertically, and store pixels in the
	    // output file.
	    //

	    if (_linesConverted > N2)
		decimateChromaVertAndWriteScanLine();

	    //
	    // If we have already converted the last scan line in
	    // the image to luminance/chroma, filter, subsample and
	    // store the remaining scan lines in _buf.
	    //

	    if (_linesConverted >= _height)
	    {
		for (int j = 0; j < N2 - _height; ++j)
		    duplicateLastBuffer();

		duplicateSecondToLastBuffer();
		++_linesConverted;
		decimateChromaVertAndWriteScanLine();

		for (int j = 1; j < min (_height, N2); ++j)
		{
		    duplicateLastBuffer();
		    ++_linesConverted;
		    decimateChromaVertAndWriteScanLine();
		}
	    }

	    if (_lineOrder == INCREASING_Y)
		++_currentScanLine;
	    else
		--_currentScanLine;
	}
    }
}